

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void soplex::MPSreadObjsen(MPSInput *mps)

{
  char *pcVar1;
  Sense SVar2;
  bool bVar3;
  int iVar4;
  
  bVar3 = MPSInput::readLine(mps);
  if ((bVar3) && (pcVar1 = mps->m_f1, pcVar1 != (char *)0x0)) {
    iVar4 = strcmp(pcVar1,"MIN");
    if (iVar4 == 0) {
      SVar2 = MINIMIZE;
    }
    else {
      iVar4 = strcmp(pcVar1,"MAX");
      if (iVar4 != 0) goto LAB_0012b22f;
      SVar2 = MAXIMIZE;
    }
    mps->m_objsense = SVar2;
    bVar3 = MPSInput::readLine(mps);
    if ((bVar3) && (pcVar1 = mps->m_f0, pcVar1 != (char *)0x0)) {
      iVar4 = strcmp(pcVar1,"ROWS");
      if (iVar4 == 0) {
        mps->m_section = ROWS;
      }
      else {
        iVar4 = strcmp(pcVar1,"OBJNAME");
        if (iVar4 != 0) goto LAB_0012b22f;
        mps->m_section = OBJNAME;
      }
      return;
    }
  }
LAB_0012b22f:
  MPSInput::syntaxError(mps);
  return;
}

Assistant:

static inline void MPSreadObjsen(MPSInput& mps)
{
   do
   {
      // This has to be the Line with MIN or MAX.
      if(!mps.readLine() || (mps.field1() == nullptr))
         break;

      if(!strcmp(mps.field1(), "MIN"))
         mps.setObjSense(MPSInput::MINIMIZE);
      else if(!strcmp(mps.field1(), "MAX"))
         mps.setObjSense(MPSInput::MAXIMIZE);
      else
         break;

      // Look for ROWS or OBJNAME Section
      if(!mps.readLine() || (mps.field0() == nullptr))
         break;

      if(!strcmp(mps.field0(), "ROWS"))
         mps.setSection(MPSInput::ROWS);
      else if(!strcmp(mps.field0(), "OBJNAME"))
         mps.setSection(MPSInput::OBJNAME);
      else
         break;

      return;
   }
   while(false);

   mps.syntaxError();
}